

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filtering_inotify_poller.cc
# Opt level: O0

bool __thiscall FilteringInotifyPoller::AddWatch(FilteringInotifyPoller *this,string *path)

{
  bool bVar1;
  int iVar2;
  byte local_19;
  string *path_local;
  FilteringInotifyPoller *this_local;
  
  bVar1 = std::
          regex_search<std::char_traits<char>,std::allocator<char>,char,std::__cxx11::regex_traits<char>>
                    (path,&this->regex_,0);
  local_19 = 0;
  if (!bVar1) {
    iVar2 = (*this->ip_->_vptr_InotifyPoller[2])(this->ip_,path);
    local_19 = (byte)iVar2;
  }
  return (bool)(local_19 & 1);
}

Assistant:

bool FilteringInotifyPoller::AddWatch(const std::string& path) {
  // Don't allow installing watches if the pathname matches.
  return !std::regex_search(path, regex_) && ip_->AddWatch(path);
}